

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O0

void __thiscall
Nova::Simplex_Mesh<3>::Find_And_Append_Adjacent_Elements
          (Simplex_Mesh<3> *this,int simplex,Vector<int,_2,_true> *face)

{
  ulong uVar1;
  bool bVar2;
  int *piVar3;
  Array<int> *pAVar4;
  size_t sVar5;
  int local_34;
  ulong uStack_30;
  int simplex2;
  size_t t;
  Vector<int,_1,_true> other_nodes;
  int first_node;
  Vector<int,_2,_true> *face_local;
  int simplex_local;
  Simplex_Mesh<3> *this_local;
  
  _other_nodes = face;
  piVar3 = Vector<int,_2,_true>::operator()(face,0);
  t._4_4_ = *piVar3;
  Vector<int,_2,_true>::Remove_Index((Vector<int,_2,_true> *)&t,(int)_other_nodes);
  uStack_30 = 0;
  while( true ) {
    uVar1 = uStack_30;
    pAVar4 = Array<Nova::Array<int>_>::operator()(this->incident_elements,t._4_4_);
    sVar5 = Array<int>::size(pAVar4);
    if (sVar5 <= uVar1) break;
    pAVar4 = Array<Nova::Array<int>_>::operator()(this->incident_elements,t._4_4_);
    piVar3 = Array<int>::operator()(pAVar4,(int)uStack_30);
    local_34 = *piVar3;
    if ((local_34 != simplex) &&
       (bVar2 = Nodes_In_Simplex<1>(this,(Vector<int,_1,_true> *)&t,local_34), bVar2)) {
      pAVar4 = Array<Nova::Array<int>_>::operator()(this->adjacent_elements,simplex);
      Array<int>::Append_Unique(pAVar4,&local_34);
    }
    uStack_30 = uStack_30 + 1;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Find_And_Append_Adjacent_Elements(const int simplex,const Vector<int,d-1>& face)
{
    int first_node=face(0);Vector<int,d-2> other_nodes=face.Remove_Index(0);
    for(size_t t=0;t<(*incident_elements)(first_node).size();++t){
        int simplex2=(*incident_elements)(first_node)(t);
        if(simplex2!=simplex && Nodes_In_Simplex(other_nodes,simplex2))
            (*adjacent_elements)(simplex).Append_Unique(simplex2);}
}